

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

DPIExportSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DPIExportSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,Token *args_4,Token *args_5,Token *args_6,
          Token *args_7)

{
  Info *pIVar1;
  Info *pIVar2;
  Info *pIVar3;
  Info *pIVar4;
  Info *pIVar5;
  Info *pIVar6;
  Info *pIVar7;
  TokenKind TVar8;
  undefined1 uVar9;
  NumericTokenFlags NVar10;
  uint32_t uVar11;
  TokenKind TVar12;
  undefined1 uVar13;
  NumericTokenFlags NVar14;
  uint32_t uVar15;
  TokenKind TVar16;
  undefined1 uVar17;
  NumericTokenFlags NVar18;
  uint32_t uVar19;
  TokenKind TVar20;
  undefined1 uVar21;
  NumericTokenFlags NVar22;
  uint32_t uVar23;
  TokenKind TVar24;
  undefined1 uVar25;
  NumericTokenFlags NVar26;
  uint32_t uVar27;
  TokenKind TVar28;
  undefined1 uVar29;
  NumericTokenFlags NVar30;
  uint32_t uVar31;
  TokenKind TVar32;
  undefined1 uVar33;
  NumericTokenFlags NVar34;
  uint32_t uVar35;
  DPIExportSyntax *this_00;
  
  this_00 = (DPIExportSyntax *)allocate(this,0xc0,8);
  TVar8 = args_1->kind;
  uVar9 = args_1->field_0x2;
  NVar10.raw = (args_1->numFlags).raw;
  uVar11 = args_1->rawLen;
  pIVar1 = args_1->info;
  TVar12 = args_2->kind;
  uVar13 = args_2->field_0x2;
  NVar14.raw = (args_2->numFlags).raw;
  uVar15 = args_2->rawLen;
  pIVar2 = args_2->info;
  TVar16 = args_3->kind;
  uVar17 = args_3->field_0x2;
  NVar18.raw = (args_3->numFlags).raw;
  uVar19 = args_3->rawLen;
  pIVar3 = args_3->info;
  TVar20 = args_4->kind;
  uVar21 = args_4->field_0x2;
  NVar22.raw = (args_4->numFlags).raw;
  uVar23 = args_4->rawLen;
  pIVar4 = args_4->info;
  TVar24 = args_5->kind;
  uVar25 = args_5->field_0x2;
  NVar26.raw = (args_5->numFlags).raw;
  uVar27 = args_5->rawLen;
  pIVar5 = args_5->info;
  TVar28 = args_6->kind;
  uVar29 = args_6->field_0x2;
  NVar30.raw = (args_6->numFlags).raw;
  uVar31 = args_6->rawLen;
  pIVar6 = args_6->info;
  TVar32 = args_7->kind;
  uVar33 = args_7->field_0x2;
  NVar34.raw = (args_7->numFlags).raw;
  uVar35 = args_7->rawLen;
  pIVar7 = args_7->info;
  slang::syntax::MemberSyntax::MemberSyntax((MemberSyntax *)this_00,DPIExport,args);
  (this_00->keyword).kind = TVar8;
  (this_00->keyword).field_0x2 = uVar9;
  (this_00->keyword).numFlags = (NumericTokenFlags)NVar10.raw;
  (this_00->keyword).rawLen = uVar11;
  (this_00->keyword).info = pIVar1;
  (this_00->specString).kind = TVar12;
  (this_00->specString).field_0x2 = uVar13;
  (this_00->specString).numFlags = (NumericTokenFlags)NVar14.raw;
  (this_00->specString).rawLen = uVar15;
  (this_00->specString).info = pIVar2;
  (this_00->c_identifier).kind = TVar16;
  (this_00->c_identifier).field_0x2 = uVar17;
  (this_00->c_identifier).numFlags = (NumericTokenFlags)NVar18.raw;
  (this_00->c_identifier).rawLen = uVar19;
  (this_00->c_identifier).info = pIVar3;
  (this_00->equals).kind = TVar20;
  (this_00->equals).field_0x2 = uVar21;
  (this_00->equals).numFlags = (NumericTokenFlags)NVar22.raw;
  (this_00->equals).rawLen = uVar23;
  (this_00->equals).info = pIVar4;
  (this_00->functionOrTask).kind = TVar24;
  (this_00->functionOrTask).field_0x2 = uVar25;
  (this_00->functionOrTask).numFlags = (NumericTokenFlags)NVar26.raw;
  (this_00->functionOrTask).rawLen = uVar27;
  (this_00->functionOrTask).info = pIVar5;
  (this_00->name).kind = TVar28;
  (this_00->name).field_0x2 = uVar29;
  (this_00->name).numFlags = (NumericTokenFlags)NVar30.raw;
  (this_00->name).rawLen = uVar31;
  (this_00->name).info = pIVar6;
  (this_00->semi).kind = TVar32;
  (this_00->semi).field_0x2 = uVar33;
  (this_00->semi).numFlags = (NumericTokenFlags)NVar34.raw;
  (this_00->semi).rawLen = uVar35;
  (this_00->semi).info = pIVar7;
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }